

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

void recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  recv_cb_called = recv_cb_called + 1;
  return;
}

Assistant:

static void recv_cb(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  uv_handle_type pending;
  uv_pipe_t* pipe;
  int r;
  union handles* recv;

  free(buf->base);

  pipe = (uv_pipe_t*) handle;
  ASSERT_PTR_EQ(pipe, &ctx.channel);

  do {
    if (++recv_cb_count == 1) {
      recv = &ctx.recv;
    } else {
      recv = &ctx.recv2;
    }

    /* Depending on the OS, the final recv_cb can be called after
     * the child process has terminated which can result in nread
     * being UV_EOF instead of the number of bytes read.  Since
     * the other end of the pipe has closed this UV_EOF is an
     * acceptable value. */
    if (nread == UV_EOF) {
      /* UV_EOF is only acceptable for the final recv_cb call */
      ASSERT_EQ(2, recv_cb_count);
    } else {
      ASSERT_GE(nread, 0);
      ASSERT_GT(uv_pipe_pending_count(pipe), 0);

      pending = uv_pipe_pending_type(pipe);
      ASSERT_EQ(pending, ctx.expected_type);

      if (pending == UV_NAMED_PIPE)
        r = uv_pipe_init(ctx.channel.loop, &recv->pipe, 0);
      else if (pending == UV_TCP)
        r = uv_tcp_init(ctx.channel.loop, &recv->tcp);
      else
        abort();
      ASSERT_OK(r);

      r = uv_accept(handle, &recv->stream);
      ASSERT_OK(r);
    }
  } while (uv_pipe_pending_count(pipe) > 0);

  /* Close after two writes received */
  if (recv_cb_count == 2) {
    uv_close((uv_handle_t*)&ctx.channel, NULL);
  }
}